

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  void *pvVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  longlong size;
  longlong words;
  longlong bi [100];
  long lStack_34180;
  long lStack_34178;
  void *pvStack_34170;
  char *pcStack_34168;
  float afStack_3415c [39];
  undefined8 auStack_340c0 [41];
  long alStack_33f78 [99];
  char cStack_33c59;
  undefined4 uStack_33c58;
  char cStack_33c54;
  float afStack_33488 [2000];
  char acStack_31548 [2000];
  char acStack_30d78 [200008];
  
  if (argc < 2) {
    puts("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT");
LAB_0010121e:
    iVar4 = 0;
  }
  else {
    strcpy(acStack_31548,argv[1]);
    __stream = fopen(acStack_31548,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Input file not found");
    }
    else {
      lVar13 = 0;
      __isoc99_fscanf(__stream,"%lld",&lStack_34178);
      __isoc99_fscanf(__stream,"%lld",&lStack_34180);
      lVar12 = lStack_34178;
      pcStack_34168 = (char *)malloc(lStack_34178 * 0x32);
      do {
        pvVar6 = malloc(2000);
        lVar7 = lStack_34180;
        auStack_340c0[lVar13 + 1] = pvVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x28);
      uVar14 = lStack_34180 * lVar12;
      pvStack_34170 = malloc(uVar14 * 4);
      if (pvStack_34170 != (void *)0x0) {
        if (0 < lStack_34178) {
          lVar12 = 0;
          lVar13 = 0;
          do {
            iVar4 = fgetc(__stream);
            pcVar8 = pcStack_34168;
            lVar7 = lVar13 * 0x32;
            pcStack_34168[lVar7] = (char)iVar4;
            iVar5 = feof(__stream);
            if ((char)iVar4 == ' ') {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              if (iVar5 == 0) {
                uVar14 = 0;
                do {
                  uVar14 = ((char)iVar4 != '\n' && uVar14 < 0x32) + uVar14;
                  iVar4 = fgetc(__stream);
                  pcVar8[uVar14 + lVar7] = (char)iVar4;
                  iVar5 = feof(__stream);
                  if ((char)iVar4 == ' ') break;
                } while (iVar5 == 0);
              }
            }
            pcVar8[uVar14 + lVar7] = '\0';
            if (0 < lStack_34180) {
              lVar7 = 0;
              pvVar6 = pvStack_34170;
              do {
                fread((void *)(lStack_34180 * lVar12 + (long)pvVar6),4,1,__stream);
                lVar7 = lVar7 + 1;
                pvVar6 = (void *)((long)pvVar6 + 4);
              } while (lVar7 < lStack_34180);
            }
            pvVar6 = pvStack_34170;
            if (lStack_34180 < 1) {
              fVar17 = 0.0;
            }
            else {
              fVar17 = 0.0;
              lVar7 = 0;
              do {
                fVar3 = *(float *)((long)pvStack_34170 + lVar7 * 4 + lStack_34180 * lVar12);
                fVar17 = fVar17 + fVar3 * fVar3;
                lVar7 = lVar7 + 1;
              } while (lStack_34180 != lVar7);
            }
            if (fVar17 < 0.0) {
              fVar17 = sqrtf(fVar17);
            }
            else {
              fVar17 = SQRT(fVar17);
            }
            if (0 < lStack_34180) {
              lVar7 = 0;
              do {
                *(float *)((long)pvVar6 + lVar7 * 4 + lStack_34180 * lVar12) =
                     *(float *)((long)pvVar6 + lVar7 * 4 + lStack_34180 * lVar12) / fVar17;
                lVar7 = lVar7 + 1;
              } while (lStack_34180 != lVar7);
            }
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 4;
          } while (lVar13 < lStack_34178);
        }
        fclose(__stream);
LAB_00101431:
        memset(afStack_3415c + 1,0,0xa0);
        lVar12 = 0;
        do {
          *(undefined1 *)auStack_340c0[lVar12 + 1] = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x28);
        printf("Enter word or sentence (EXIT to break): ");
        uVar14 = 0;
        do {
          uVar10 = uVar14;
          iVar4 = fgetc(_stdin);
          *(char *)((long)&uStack_33c58 + uVar10) = (char)iVar4;
          if ((char)iVar4 == '\n') break;
          uVar14 = uVar10 + 1;
        } while (uVar10 < 1999);
        *(undefined1 *)((long)&uStack_33c58 + uVar10) = 0;
        if (cStack_33c54 != '\0' || uStack_33c58 != 0x54495845) {
          pcVar8 = acStack_30d78 + 1;
          lVar12 = 0;
          lVar13 = 0;
          do {
            lVar12 = lVar12 + 1;
            pcVar11 = pcVar8;
            do {
              pcVar11[-1] = (&cStack_33c59)[lVar12];
              *pcVar11 = '\0';
              pcVar2 = (char *)((long)&uStack_33c58 + lVar12);
              if (*pcVar2 == '\0') {
                lVar12 = 0;
                goto LAB_001014fe;
              }
              pcVar11 = pcVar11 + 1;
              lVar12 = lVar12 + 1;
            } while (*pcVar2 != ' ');
            lVar13 = lVar13 + 1;
            pcVar8 = pcVar8 + 2000;
          } while( true );
        }
        goto LAB_0010121e;
      }
      printf("Cannot allocate memory: %lld MB    %lld  %lld\n",uVar14 >> 0x12 & 0xfffffffffff,lVar12
             ,lVar7);
    }
    iVar4 = -1;
  }
  return iVar4;
  while (bVar16 = lVar12 != lVar13, lVar12 = lVar12 + 1, bVar16) {
LAB_001014fe:
    lVar7 = lStack_34178;
    if (lStack_34178 < 1) {
      lVar9 = 0;
    }
    else {
      lVar15 = 0;
      pcVar8 = pcStack_34168;
      do {
        iVar4 = strcmp(pcVar8,acStack_30d78 + lVar12 * 2000);
        lVar9 = lVar15;
        if (iVar4 == 0) break;
        lVar15 = lVar15 + 1;
        pcVar8 = pcVar8 + 0x32;
        lVar9 = lVar7;
      } while (lVar7 != lVar15);
    }
    lVar15 = lVar9;
    if (lVar9 == lVar7) {
      lVar15 = -1;
    }
    alStack_33f78[lVar12] = lVar15;
    printf("\nWord: %s  Position in vocabulary: %lld\n",acStack_30d78 + lVar12 * 2000,lVar15);
    if (lVar9 == lVar7) {
      puts("Out of dictionary word!");
      break;
    }
  }
  pvVar6 = pvStack_34170;
  if (lVar15 != -1) {
    puts(
        "\n                                              Word       Cosine distance\n------------------------------------------------------------------------"
        );
    lVar12 = lStack_34180;
    if (0 < lStack_34180) {
      memset(afStack_33488,0,lStack_34180 * 4);
    }
    lVar7 = 0;
    do {
      lVar9 = alStack_33f78[lVar7];
      if (lVar9 != -1 && 0 < lVar12) {
        lVar15 = 0;
        do {
          afStack_33488[lVar15] =
               *(float *)((long)pvVar6 + lVar15 * 4 + lVar9 * lVar12 * 4) + afStack_33488[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar12 != lVar15);
      }
      bVar16 = lVar7 != lVar13;
      lVar7 = lVar7 + 1;
    } while (bVar16);
    fVar17 = 0.0;
    if (0 < lVar12) {
      lVar7 = 0;
      do {
        fVar17 = fVar17 + afStack_33488[lVar7] * afStack_33488[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar12 != lVar7);
    }
    if (fVar17 < 0.0) {
      fVar17 = sqrtf(fVar17);
    }
    else {
      fVar17 = SQRT(fVar17);
    }
    if (0 < lStack_34180) {
      lVar12 = 0;
      do {
        afStack_33488[lVar12] = afStack_33488[lVar12] / fVar17;
        lVar12 = lVar12 + 1;
      } while (lStack_34180 != lVar12);
    }
    lVar12 = 0;
    do {
      afStack_3415c[lVar12 + 1] = -1.0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x28);
    lVar12 = 0;
    do {
      *(undefined1 *)auStack_340c0[lVar12 + 1] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x28);
    if (0 < lStack_34178) {
      lVar12 = 0;
      lVar7 = 0;
      do {
        lVar9 = -1;
        bVar16 = false;
        do {
          if (alStack_33f78[lVar9 + 1] == lVar7) {
            bVar16 = true;
          }
          lVar9 = lVar9 + 1;
        } while (lVar13 != lVar9);
        if (!bVar16) {
          if (lStack_34180 < 1) {
            fVar17 = 0.0;
          }
          else {
            fVar17 = 0.0;
            lVar9 = 0;
            do {
              fVar17 = fVar17 + afStack_33488[lVar9] *
                                *(float *)((long)pvVar6 + lVar9 * 4 + lStack_34180 * lVar12);
              lVar9 = lVar9 + 1;
            } while (lStack_34180 != lVar9);
          }
          uVar14 = 0;
LAB_0010173b:
          if (fVar17 < afStack_3415c[uVar14 + 1] || fVar17 == afStack_3415c[uVar14 + 1])
          goto code_r0x00101743;
          afStack_3415c[0] = fVar17;
          if (uVar14 < 0x27) {
            uVar10 = 0x27;
            do {
              uVar1 = uVar10 - 1;
              afStack_3415c[uVar10 + 1] = afStack_3415c[uVar10];
              strcpy((char *)auStack_340c0[uVar10 + 1],(char *)auStack_340c0[uVar10]);
              uVar10 = uVar1;
            } while (uVar14 < uVar1);
          }
          afStack_3415c[uVar14 + 1] = afStack_3415c[0];
          strcpy((char *)auStack_340c0[uVar14 + 1],pcStack_34168 + lVar7 * 0x32);
        }
LAB_001017b4:
        lVar7 = lVar7 + 1;
        lVar12 = lVar12 + 4;
      } while (lVar7 < lStack_34178);
    }
    lVar12 = 0;
    do {
      printf("%50s\t\t%f\n",(double)afStack_3415c[lVar12 + 1]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x28);
  }
  goto LAB_00101431;
code_r0x00101743:
  uVar14 = uVar14 + 1;
  if (uVar14 == 0x28) goto LAB_001017b4;
  goto LAB_0010173b;
}

Assistant:

int main(int argc, char **argv) {
  FILE *f;
  char st1[max_size];
  char *bestw[N];
  char file_name[max_size], st[100][max_size];
  float dist, len, bestd[N], vec[max_size];
  long long words, size, a, b, c, d, cn, bi[100];
  // char ch;
  float *M;
  char *vocab;
  if (argc < 2) {
    printf("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT\n");
    return 0;
  }
  strcpy(file_name, argv[1]);
  f = fopen(file_name, "rb");
  if (f == NULL) {
    printf("Input file not found\n");
    return -1;
  }
  fscanf(f, "%lld", &words);
  fscanf(f, "%lld", &size);
  vocab = (char *)malloc((long long)words * max_w * sizeof(char));
  for (a = 0; a < N; a++) bestw[a] = (char *)malloc(max_size * sizeof(char));
  M = (float *)malloc((long long)words * (long long)size * sizeof(float));
  if (M == NULL) {
    printf("Cannot allocate memory: %lld MB    %lld  %lld\n", (long long)words * size * sizeof(float) / 1048576, words, size);
    return -1;
  }
  for (b = 0; b < words; b++) {
    a = 0;
    while (1) {
      vocab[b * max_w + a] = fgetc(f);
      if (feof(f) || (vocab[b * max_w + a] == ' ')) break;
      if ((a < max_w) && (vocab[b * max_w + a] != '\n')) a++;
    }
    vocab[b * max_w + a] = 0;
    for (a = 0; a < size; a++) fread(&M[a + b * size], sizeof(float), 1, f);
    len = 0;
    for (a = 0; a < size; a++) len += M[a + b * size] * M[a + b * size];
    len = sqrt(len);
    for (a = 0; a < size; a++) M[a + b * size] /= len;
  }
  fclose(f);
  while (1) {
    for (a = 0; a < N; a++) bestd[a] = 0;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    printf("Enter word or sentence (EXIT to break): ");
    a = 0;
    while (1) {
      st1[a] = fgetc(stdin);
      if ((st1[a] == '\n') || (a >= max_size - 1)) {
        st1[a] = 0;
        break;
      }
      a++;
    }
    if (!strcmp(st1, "EXIT")) break;
    cn = 0;
    b = 0;
    c = 0;
    while (1) {
      st[cn][b] = st1[c];
      b++;
      c++;
      st[cn][b] = 0;
      if (st1[c] == 0) break;
      if (st1[c] == ' ') {
        cn++;
        b = 0;
        c++;
      }
    }
    cn++;
    for (a = 0; a < cn; a++) {
      for (b = 0; b < words; b++) if (!strcmp(&vocab[b * max_w], st[a])) break;
      if (b == words) b = -1;
      bi[a] = b;
      printf("\nWord: %s  Position in vocabulary: %lld\n", st[a], bi[a]);
      if (b == -1) {
        printf("Out of dictionary word!\n");
        break;
      }
    }
    if (b == -1) continue;
    printf("\n                                              Word       Cosine distance\n------------------------------------------------------------------------\n");
    for (a = 0; a < size; a++) vec[a] = 0;
    for (b = 0; b < cn; b++) {
      if (bi[b] == -1) continue;
      for (a = 0; a < size; a++) vec[a] += M[a + bi[b] * size];
    }
    len = 0;
    for (a = 0; a < size; a++) len += vec[a] * vec[a];
    len = sqrt(len);
    for (a = 0; a < size; a++) vec[a] /= len;
    for (a = 0; a < N; a++) bestd[a] = -1;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    for (c = 0; c < words; c++) {
      a = 0;
      for (b = 0; b < cn; b++) if (bi[b] == c) a = 1;
      if (a == 1) continue;
      dist = 0;
      for (a = 0; a < size; a++) dist += vec[a] * M[a + c * size];
      for (a = 0; a < N; a++) {
        if (dist > bestd[a]) {
          for (d = N - 1; d > a; d--) {
            bestd[d] = bestd[d - 1];
            strcpy(bestw[d], bestw[d - 1]);
          }
          bestd[a] = dist;
          strcpy(bestw[a], &vocab[c * max_w]);
          break;
        }
      }
    }
    for (a = 0; a < N; a++) printf("%50s\t\t%f\n", bestw[a], bestd[a]);
  }
  return 0;
}